

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * Extra_zddSelectOneSubset(DdManager *dd,DdNode *zS)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddSelectOneSubset(dd,zS);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode* Extra_zddSelectOneSubset( 
  DdManager * dd,   /* the DD manager */
  DdNode * zS)      /* the ZDD */
{
    DdNode  *res;
    do {
        dd->reordered = 0;
        res = extraZddSelectOneSubset(dd, zS);
    } while (dd->reordered == 1);
    return(res);

}